

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

int __thiscall FStateDefinitions::GetStateLabelIndex(FStateDefinitions *this,FName *statename)

{
  FStateDefine *pFVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(this->StateLabels).Count;
  if (uVar3 != 0) {
    pFVar1 = (this->StateLabels).Array;
    lVar2 = 0;
    do {
      if (*(int *)((long)&(pFVar1->Label).Index + lVar2) == statename->Index) {
        uVar3 = *(ulong *)((long)&pFVar1->State + lVar2);
        if (uVar3 <= (this->StateArray).Count + 1) {
          return (int)uVar3 + -1;
        }
        __assert_fail("(size_t)std->State <= StateArray.Size() + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_states.cpp"
                      ,0x1a2,"int FStateDefinitions::GetStateLabelIndex(FName)");
      }
      lVar2 = lVar2 + 0x28;
    } while (uVar3 * 0x28 != lVar2);
  }
  return -1;
}

Assistant:

int FStateDefinitions::GetStateLabelIndex (FName statename)
{
	FStateDefine *std = FindStateLabelInList(StateLabels, statename, false);
	if (std == NULL)
	{
		return -1;
	}
	assert((size_t)std->State <= StateArray.Size() + 1);
	return (int)((ptrdiff_t)std->State - 1);
}